

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

string * ot::commissioner::utils::Hex<unsigned_long>
                   (string *__return_storage_ptr__,unsigned_long aInteger)

{
  ByteArray *aBytes;
  ByteArray local_88;
  string local_70;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  unsigned_long local_18;
  unsigned_long aInteger_local;
  
  local_18 = aInteger;
  aInteger_local = (unsigned_long)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"0x",&local_39);
  Encode<unsigned_long>(&local_88,local_18);
  Hex_abi_cxx11_(&local_70,(utils *)&local_88,aBytes);
  std::operator+(__return_storage_ptr__,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_88);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string Hex(T aInteger)
{
    return std::string("0x") + Hex(Encode(aInteger));
}